

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O2

wchar_t borg_best_mult(borg_item *obj,monster_race *r_ptr)

{
  int flag;
  slay_conflict *psVar1;
  brand_conflict *pbVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  bitflag *flags;
  long lVar6;
  wchar_t *pwVar7;
  _Bool *p_Var8;
  ulong uVar9;
  
  flags = r_ptr->flags;
  p_Var8 = obj->brands;
  wVar5 = L'\x01';
  lVar6 = 0x58;
  for (uVar9 = 1; pbVar2 = brands, p_Var8 = p_Var8 + 1, uVar9 < z_info->brand_max; uVar9 = uVar9 + 1
      ) {
    if ((obj == (borg_item *)0x0) || (obj->iqty == '\0')) {
      _Var3 = player_has_temporary_brand(player,(wchar_t)uVar9);
      if (_Var3) goto LAB_001fe910;
    }
    else if (*p_Var8 != false) {
LAB_001fe910:
      _Var3 = flag_has_dbg(flags,0xb,*(int *)((long)pbVar2 + lVar6 + -8),"r_ptr->flags",
                           "brand->resist_flag");
      if (!_Var3) {
        flag = *(int *)((long)pbVar2 + lVar6 + -4);
        wVar4 = *(wchar_t *)((long)&pbVar2->code + lVar6);
        if (flag != 0) {
          _Var3 = flag_has_dbg(flags,0xb,flag,"r_ptr->flags","brand->vuln_flag");
          wVar4 = wVar4 << _Var3;
        }
        if (wVar5 < wVar4) {
          wVar5 = wVar4;
        }
      }
    }
    lVar6 = lVar6 + 0x38;
  }
  pwVar7 = obj->slays;
  uVar9 = 1;
  lVar6 = 0x1b;
  do {
    psVar1 = slays;
    pwVar7 = pwVar7 + 1;
    if (z_info->slay_max <= uVar9) {
      return wVar5;
    }
    if ((obj == (borg_item *)0x0) || (obj->iqty == '\0')) {
      _Var3 = player_has_temporary_slay(player,(wchar_t)uVar9);
      if (_Var3) goto LAB_001fe9bf;
    }
    else if (*pwVar7 != L'\0') {
LAB_001fe9bf:
      _Var3 = flag_has_dbg(flags,0xb,*(int *)((long)psVar1 + lVar6 * 4 + -4),"r_ptr->flags",
                           "slay->race_flag");
      if ((_Var3) && (wVar4 = *(wchar_t *)((long)&psVar1->code + lVar6 * 4), wVar5 < wVar4)) {
        wVar5 = wVar4;
      }
    }
    uVar9 = uVar9 + 1;
    lVar6 = lVar6 + 0x10;
  } while( true );
}

Assistant:

static int borg_best_mult(borg_item *obj, struct monster_race *r_ptr)
{
    int i;
    int max_mult = 1;

    /* Brands */
    for (i = 1; i < z_info->brand_max; i++) {
        struct brand *brand = &brands[i];
        if (obj && obj->iqty) {
            /* Brand is on an object */
            if (!obj->brands[i])
                continue;
        } else {
            /* Temporary brand */
            if (!player_has_temporary_brand(player, i))
                continue;
        }

        /* Is the monster vulnerable? */
        if (!rf_has(r_ptr->flags, brand->resist_flag)) {
            int mult = brand->multiplier;
            if (brand->vuln_flag && rf_has(r_ptr->flags, brand->vuln_flag)) {
                mult *= 2;
            }
            max_mult = MAX(mult, max_mult);
        }
    }

    /* Slays */
    for (i = 1; i < z_info->slay_max; i++) {
        struct slay *slay = &slays[i];
        if (obj && obj->iqty) {
            /* Slay is on an object */
            if (!obj->slays[i])
                continue;
        } else {
            /* Temporary slay */
            if (!player_has_temporary_slay(player, i))
                continue;
        }

        if (rf_has(r_ptr->flags, slay->race_flag)) {
            max_mult = MAX(slay->multiplier, max_mult);
        }
    }
    return max_mult;
}